

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

int __thiscall ghc::filesystem::rename(filesystem *this,char *__old,char *__new)

{
  bool bVar1;
  uint uVar3;
  undefined7 extraout_var;
  value_type *__old_00;
  value_type *__new_00;
  char *pcVar4;
  error_code eVar5;
  path *in_stack_ffffffffffffffc8;
  error_code *in_stack_ffffffffffffffd0;
  undefined4 uStack_24;
  int iVar2;
  
  std::error_code::clear(in_stack_ffffffffffffffd0);
  bVar1 = operator!=((path *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  iVar2 = (int)CONCAT71(extraout_var,bVar1);
  if (bVar1) {
    __old_00 = path::c_str((path *)0x29132c);
    __new_00 = path::c_str((path *)0x29133b);
    uVar3 = ::rename(__old_00,__new_00);
    pcVar4 = (char *)(ulong)uVar3;
    if (uVar3 != 0) {
      eVar5 = detail::make_system_error((int)((ulong)__old_00 >> 0x20));
      *(ulong *)__new = CONCAT44(uStack_24,eVar5._M_value);
      *(error_category **)(__new + 8) = eVar5._M_cat;
      pcVar4 = __new;
    }
    iVar2 = (int)pcVar4;
  }
  return iVar2;
}

Assistant:

GHC_INLINE void rename(const path& from, const path& to, std::error_code& ec) noexcept
{
    ec.clear();
#ifdef GHC_OS_WINDOWS
    if (from != to) {
        if (!MoveFileExW(GHC_NATIVEWP(from), GHC_NATIVEWP(to), (DWORD)MOVEFILE_REPLACE_EXISTING)) {
            ec = detail::make_system_error();
        }
    }
#else
    if (from != to) {
        if (::rename(from.c_str(), to.c_str()) != 0) {
            ec = detail::make_system_error();
        }
    }
#endif
}